

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O1

void __thiscall
Imf_3_4::DeepTiledInputFile::DeepTiledInputFile
          (DeepTiledInputFile *this,char *filename,ContextInitializer *ctxtinit,int numThreads)

{
  undefined1 local_31;
  int local_30;
  int local_2c;
  DeepTiledInputFile *local_28;
  
  local_2c = numThreads;
  Context::Context();
  local_30 = 0;
  (this->_data).super___shared_ptr<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_28 = this;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Imf_3_4::DeepTiledInputFile::Data,std::allocator<Imf_3_4::DeepTiledInputFile::Data>,Imf_3_4::Context*,int,int&>
            (&(this->_data).
              super___shared_ptr<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(Data **)&this->_data,
             (allocator<Imf_3_4::DeepTiledInputFile::Data> *)&local_31,(Context **)&local_28,
             &local_30,&local_2c);
  Data::initialize((this->_data).
                   super___shared_ptr<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
  return;
}

Assistant:

DeepTiledInputFile::DeepTiledInputFile (
    const char*               filename,
    const ContextInitializer& ctxtinit,
    int                       numThreads)
    : _ctxt (filename, ctxtinit, Context::read_mode_t{})
    , _data (std::make_shared<Data> (&_ctxt, 0, numThreads))
{
    _data->initialize ();
}